

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hpp
# Opt level: O2

void __thiscall
tf::Executor::_tear_down_dependent_async(Executor *this,Worker *worker,Node *node,Node **cache)

{
  int *piVar1;
  long *plVar2;
  atomic<unsigned_long> *paVar3;
  void *pvVar4;
  Node *pNVar5;
  size_t i;
  ulong uVar6;
  handle_t *phVar7;
  bool bVar8;
  
  phVar7 = &node->_handle;
  if (*(__index_type *)
       ((long)&(node->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 0x38) != '\b') {
    phVar7 = (handle_t *)0x0;
  }
  do {
    piVar1 = (int *)((long)&(phVar7->
                            super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            ).
                            super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            ._M_u + 0x30);
    LOCK();
    bVar8 = *piVar1 == 0;
    if (bVar8) {
      *piVar1 = 2;
    }
    UNLOCK();
  } while (!bVar8);
  for (uVar6 = 0;
      pvVar4 = (node->_edges).super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX,
      uVar6 < (ulong)((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                            super_SmallVectorTemplateBase<tf::Node_*,_true>.
                            super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                            EndX - (long)pvVar4 >> 3); uVar6 = uVar6 + 1) {
    pNVar5 = *(Node **)((long)pvVar4 + uVar6 * 8);
    LOCK();
    paVar3 = &pNVar5->_join_counter;
    (paVar3->super___atomic_base<unsigned_long>)._M_i =
         (paVar3->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if ((paVar3->super___atomic_base<unsigned_long>)._M_i == 0) {
      if (*cache != (Node *)0x0) {
        _schedule(this,worker,*cache);
      }
      *cache = pNVar5;
    }
  }
  LOCK();
  plVar2 = (long *)((long)&(phVar7->
                           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           ).
                           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           ._M_u + 0x28);
  *plVar2 = *plVar2 + -1;
  UNLOCK();
  if (*plVar2 == 0) {
    Node::~Node(node);
    operator_delete(node,0xd8);
  }
  _decrement_topology(this);
  return;
}

Assistant:

inline void Executor::_tear_down_dependent_async(Worker& worker, Node* node, Node*& cache) {

  auto handle = std::get_if<Node::DependentAsync>(&(node->_handle));

  // this async task comes from Executor
  auto target = ASTATE::UNFINISHED;

  while(!handle->state.compare_exchange_weak(target, ASTATE::FINISHED,
                                             std::memory_order_acq_rel,
                                             std::memory_order_relaxed)) {
    target = ASTATE::UNFINISHED;
  }
  
  // spawn successors whenever their dependencies are resolved
  for(size_t i=0; i<node->_edges.size(); ++i) {
    if(auto s = node->_edges[i]; 
      s->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1
    ) {
      _update_cache(worker, cache, s);
    }
  }
  
  // now the executor no longer needs to retain ownership
  if(handle->use_count.fetch_sub(1, std::memory_order_acq_rel) == 1) {
    recycle(node);
  }

  _decrement_topology();
}